

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list_tests.cpp
# Opt level: O0

void __thiscall
omp_make_loaded_list_empty_test_Test::TestBody(omp_make_loaded_list_empty_test_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  TypedExpectation<bool_(long_*)> *this_00;
  Function<void_()> *in_RCX;
  char *pcVar3;
  char *in_R9;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  const_iterator local_170;
  const_iterator local_158;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
  list;
  int local_ac;
  DoAllAction<testing::internal::SetArgumentPointeeAction<0UL,_int,_void>,_testing::internal::ReturnAction<bool>_>
  local_a8;
  Action<bool_(long_*)> local_90;
  WithoutMatchers local_69;
  MockSpec<bool_(long_*)> local_68;
  undefined1 local_31 [17];
  undefined1 local_20 [8];
  shared_ptr<(anonymous_namespace)::TestMock> mock;
  omp_make_loaded_list_empty_test_Test *this_local;
  
  mock.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<(anonymous_namespace)::TestMock>();
  peVar2 = std::__shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2> *)
                      local_20);
  testing::internal::GetWithoutMatchers();
  local_31._1_8_ =
       anon_unknown.dwarf_3cf32::TestMock::gmock_LoadDataList
                 ((MockSpec<void_()> *)peVar2,(TestMock *)local_31,(WithoutMatchers *)0x0,in_RCX);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)(local_31 + 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
             ,0x30,"*mock.get()","LoadDataList");
  peVar2 = std::__shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2> *)
                      local_20);
  testing::internal::GetWithoutMatchers();
  anon_unknown.dwarf_3cf32::TestMock::gmock_Count
            (&local_68,peVar2,&local_69,(Function<bool_(long_*)> *)0x0);
  pcVar3 = "*mock.get()";
  this_00 = testing::internal::MockSpec<bool_(long_*)>::InternalExpectedAt
                      (&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
                       ,0x32,"*mock.get()","Count");
  local_ac = (int)testing::SetArgPointee<0ul,int>(0);
  testing::Return<bool>((testing *)&list.count,true);
  testing::
  DoAll<testing::internal::SetArgumentPointeeAction<0ul,int,void>,testing::internal::ReturnAction<bool>>
            (&local_a8,(testing *)&local_ac,(SetArgumentPointeeAction<0UL,_int,_void> *)&list.count,
             (ReturnAction<bool> *)pcVar3);
  testing::internal::DoAllAction::operator_cast_to_Action(&local_90,(DoAllAction *)&local_a8);
  testing::internal::TypedExpectation<bool_(long_*)>::WillRepeatedly(this_00,&local_90);
  testing::Action<bool_(long_*)>::~Action(&local_90);
  testing::internal::
  DoAllAction<testing::internal::SetArgumentPointeeAction<0UL,_int,_void>,_testing::internal::ReturnAction<bool>_>
  ::~DoAllAction(&local_a8);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&list.count);
  testing::internal::MockSpec<bool_(long_*)>::~MockSpec(&local_68);
  omp::make_loaded_list<(anonymous_namespace)::TestMock>
            ((loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
              *)&gtest_ar_.message_,(shared_ptr<(anonymous_namespace)::TestMock> *)local_20);
  local_e9 = std::
             empty<omp::loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,long,(anonymous_namespace)::TestValue>>>
                       ((loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
                         *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_e8,(AssertionResult *)"std::empty(list)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
               ,0x37,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::
    cbegin<omp::loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,long,(anonymous_namespace)::TestValue>>>
              (&local_158,
               (loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
                *)&gtest_ar_.message_);
    std::
    cend<omp::loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,long,(anonymous_namespace)::TestValue>>>
              (&local_170,
               (loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
                *)&gtest_ar_.message_);
    local_139 = omp::
                loaded_list_wrapper_iterator<omp::loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>,_long,_(anonymous_namespace)::TestValue>
                ::operator==(&local_158,&local_170);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_138,&local_139,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a0,(internal *)local_138,
                 (AssertionResult *)"std::cbegin(list) == std::cend(list)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
                 ,0x38,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      testing::Message::~Message(&local_178);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  omp::
  loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
  ::~loaded_list_wrapper
            ((loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
              *)&gtest_ar_.message_);
  std::shared_ptr<(anonymous_namespace)::TestMock>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::TestMock> *)local_20);
  return;
}

Assistant:

TEST(omp_make_loaded_list, empty_test) {
  auto mock = std::make_shared<TestMock>();

  EXPECT_CALL(*mock.get(), LoadDataList);

  EXPECT_CALL(*mock.get(), Count)
      .WillRepeatedly(DoAll(SetArgPointee<0>(0), Return(true)));

  auto list = omp::make_loaded_list(mock);

  ASSERT_TRUE(std::empty(list));
  ASSERT_TRUE(std::cbegin(list) == std::cend(list));
}